

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

int fct_clp__is_param(fct_clp_t *clp,char *param)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  char *s1;
  size_t idx;
  
  sVar1 = ::clp.param_list.used_itm_num;
  if (clp == (fct_clp_t *)0x0) {
    return 0;
  }
  sVar2 = 0;
  do {
    idx = sVar2;
    if (sVar1 == idx) break;
    s1 = (char *)fct_nlist__at(&::clp.param_list,idx);
    iVar3 = fctstr_eq(s1,(char *)clp);
    sVar2 = idx + 1;
  } while (iVar3 == 0);
  return (int)(sVar1 != idx);
}

Assistant:

static int
fct_clp__is_param(fct_clp_t *clp, char const *param)
{
    if ( clp == NULL || param == NULL )
    {
        return 0;
    }
    FCT_NLIST_FOREACH_BGN(char *, aparam, &(clp->param_list))
    {
        if ( fctstr_eq(aparam, param) )
        {
            return 1;
        }
    }
    FCT_NLIST_FOREACH_END();
    return 0;
}